

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Linear_Object_State_PDU.cpp
# Opt level: O1

void __thiscall
KDIS::PDU::Linear_Object_State_PDU::Linear_Object_State_PDU
          (Linear_Object_State_PDU *this,Header *H,KDataStream *stream)

{
  Object_State_Header::Object_State_Header(&this->super_Object_State_Header,H);
  (this->super_Object_State_Header).super_Header.super_Header6._vptr_Header6 =
       (_func_int **)&PTR__Linear_Object_State_PDU_0022c978;
  DATA_TYPE::SimulationIdentifier::SimulationIdentifier(&this->m_ReqID);
  DATA_TYPE::SimulationIdentifier::SimulationIdentifier(&this->m_RecvID);
  DATA_TYPE::ObjectType::ObjectType(&this->m_ObjTyp);
  (this->m_vSegments).
  super__Vector_base<KDIS::DATA_TYPE::LinearSegmentParameter,_std::allocator<KDIS::DATA_TYPE::LinearSegmentParameter>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_vSegments).
  super__Vector_base<KDIS::DATA_TYPE::LinearSegmentParameter,_std::allocator<KDIS::DATA_TYPE::LinearSegmentParameter>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_vSegments).
  super__Vector_base<KDIS::DATA_TYPE::LinearSegmentParameter,_std::allocator<KDIS::DATA_TYPE::LinearSegmentParameter>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (*(this->super_Object_State_Header).super_Header.super_Header6._vptr_Header6[3])(this,stream,1);
  return;
}

Assistant:

Linear_Object_State_PDU::Linear_Object_State_PDU(const Header &H, KDataStream &stream) noexcept(false) :
    Object_State_Header( H )
{
    Decode( stream, true );
}